

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

int loader_load_from_package(char *tag,char *path,void **handle)

{
  int iVar1;
  plugin ppVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  plugin p;
  void **in_stack_00001008;
  char *in_stack_00001010;
  loader_impl in_stack_00001018;
  plugin in_stack_00001020;
  plugin_manager in_stack_00001028;
  char *in_stack_ffffffffffffffc8;
  int local_4;
  
  iVar1 = loader_initialize();
  if (iVar1 == 1) {
    local_4 = 1;
  }
  else {
    ppVar2 = loader_get_impl_plugin(in_stack_ffffffffffffffc8);
    if (ppVar2 == (plugin)0x0) {
      log_write_impl_va("metacall",0x17e,"loader_load_from_package",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                        ,3,"Tried to load a package from non existent loader (%s): %s",in_RDI,in_RSI
                       );
      local_4 = 1;
    }
    else {
      plugin_impl(ppVar2);
      local_4 = loader_impl_load_from_package
                          (in_stack_00001028,in_stack_00001020,in_stack_00001018,in_stack_00001010,
                           in_stack_00001008);
    }
  }
  return local_4;
}

Assistant:

int loader_load_from_package(const loader_tag tag, const loader_path path, void **handle)
{
	if (loader_initialize() == 1)
	{
		return 1;
	}

	plugin p = loader_get_impl_plugin(tag);

	if (p == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Tried to load a package from non existent loader (%s): %s", tag, path);
		return 1;
	}

	/* TODO: Disable logs here until log is completely thread safe and async signal safe */
	/* log_write("metacall", LOG_LEVEL_DEBUG, "Loading package (%s): %s", tag, path); */

	return loader_impl_load_from_package(&loader_manager, p, plugin_impl_type(p, loader_impl), path, handle);
}